

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O2

void av1_convolve_y_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  ulong uVar1;
  undefined8 uVar2;
  ushort uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  longlong lVar19;
  __m128i alVar20;
  longlong lVar21;
  __m128i alVar22;
  __m128i alVar23;
  longlong lVar24;
  __m128i alVar25;
  __m128i alVar26;
  long lVar27;
  long lVar28;
  uint8_t *puVar29;
  ulong uVar30;
  uint8_t *puVar31;
  long lVar32;
  uint8_t *puVar33;
  long lVar34;
  long lVar35;
  uint8_t uVar36;
  undefined2 uVar37;
  undefined1 uVar73;
  int extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  int extraout_XMM0_Da_01;
  int extraout_XMM0_Da_02;
  int extraout_XMM0_Da_03;
  int extraout_XMM0_Da_04;
  undefined8 extraout_XMM0_Qa;
  undefined1 uVar77;
  undefined1 uVar79;
  undefined1 uVar81;
  int extraout_XMM0_Db;
  int extraout_XMM0_Dc;
  int extraout_XMM0_Dd;
  undefined1 auVar38 [16];
  int extraout_XMM0_Db_00;
  int extraout_XMM0_Dc_00;
  int extraout_XMM0_Dd_00;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 uVar71;
  undefined1 uVar75;
  undefined1 uVar83;
  undefined1 auVar47 [16];
  int extraout_XMM0_Db_01;
  int extraout_XMM0_Dc_01;
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd_01;
  undefined1 auVar54 [16];
  undefined8 extraout_XMM0_Qa_00;
  int extraout_XMM0_Db_02;
  int extraout_XMM0_Dc_02;
  undefined8 extraout_XMM0_Qb_00;
  int extraout_XMM0_Dd_02;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar62 [16];
  uint8_t uVar72;
  uint8_t uVar74;
  uint8_t uVar76;
  uint8_t uVar78;
  uint8_t uVar80;
  uint8_t uVar82;
  uint8_t uVar84;
  undefined8 extraout_XMM0_Qa_01;
  int extraout_XMM0_Db_03;
  int extraout_XMM0_Dc_03;
  undefined8 extraout_XMM0_Qb_01;
  int extraout_XMM0_Dd_03;
  undefined1 auVar69 [16];
  undefined8 extraout_XMM0_Qa_02;
  int extraout_XMM0_Db_04;
  int extraout_XMM0_Dc_04;
  undefined8 extraout_XMM0_Qb_02;
  int extraout_XMM0_Dd_04;
  undefined1 auVar70 [16];
  undefined1 uVar132;
  undefined1 uVar133;
  ulong uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar93 [16];
  undefined1 auVar100 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar116 [16];
  __m128i alVar123;
  undefined1 auVar131 [16];
  undefined1 uVar136;
  undefined1 uVar137;
  undefined1 uVar138;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 uVar153;
  undefined1 uVar154;
  undefined1 uVar155;
  undefined1 auVar139 [16];
  undefined1 auVar146 [16];
  undefined1 auVar156 [16];
  undefined1 auVar163 [16];
  undefined1 auVar170 [16];
  undefined1 auVar177 [16];
  undefined1 auVar184 [16];
  undefined1 auVar191 [16];
  __m128i s [8];
  __m128i coeffs [6];
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  undefined1 local_228 [2];
  uint8_t uStack_226;
  undefined1 uStack_225;
  uint8_t uStack_224;
  undefined1 uStack_223;
  uint8_t uStack_222;
  undefined1 uStack_221;
  uint8_t uStack_220;
  undefined1 uStack_21f;
  uint8_t uStack_21e;
  undefined1 uStack_21d;
  uint8_t uStack_21c;
  undefined1 uStack_21b;
  uint8_t uStack_21a;
  undefined1 uStack_219;
  undefined1 local_218 [2];
  uint8_t uStack_216;
  undefined1 uStack_215;
  uint8_t uStack_214;
  undefined1 uStack_213;
  uint8_t uStack_212;
  undefined1 uStack_211;
  uint8_t uStack_210;
  undefined1 uStack_20f;
  uint8_t uStack_20e;
  undefined1 uStack_20d;
  uint8_t uStack_20c;
  undefined1 uStack_20b;
  uint8_t uStack_20a;
  undefined1 uStack_209;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  __m128i local_1c8;
  __m128i local_1b8;
  __m128i local_1a8;
  __m128i local_198;
  __m128i local_188;
  __m128i local_178;
  undefined1 local_168 [2];
  uint8_t uStack_166;
  undefined1 uStack_165;
  uint8_t uStack_164;
  undefined1 uStack_163;
  uint8_t uStack_162;
  undefined1 uStack_161;
  uint8_t uStack_160;
  undefined1 uStack_15f;
  uint8_t uStack_15e;
  undefined1 uStack_15d;
  uint8_t uStack_15c;
  undefined1 uStack_15b;
  uint8_t uStack_15a;
  undefined1 uStack_159;
  __m128i local_158;
  __m128i local_148;
  __m128i local_138;
  uint8_t local_128;
  undefined1 uStack_127;
  uint8_t uStack_126;
  undefined1 uStack_125;
  uint8_t uStack_124;
  undefined1 uStack_123;
  uint8_t uStack_122;
  undefined1 uStack_121;
  uint8_t uStack_120;
  undefined1 uStack_11f;
  uint8_t uStack_11e;
  undefined1 uStack_11d;
  uint8_t uStack_11c;
  undefined1 uStack_11b;
  uint8_t uStack_11a;
  undefined1 uStack_119;
  __m128i local_118;
  __m128i local_108;
  __m128i local_f8;
  __m128i local_e8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  longlong local_98 [13];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  
  local_108[1] = local_108[0];
  uVar3 = filter_params_y->taps;
  if (uVar3 < 9) {
    lVar27 = (long)(int)(((uVar3 >> 1) - 1) * src_stride);
    puVar31 = src + -lVar27;
    prepare_coeffs(filter_params_y,subpel_y_qn,(__m128i *)local_98);
    if (w < 5) {
      uVar4 = *(undefined4 *)puVar31;
      lVar27 = (long)src_stride;
      uVar5 = *(undefined4 *)(puVar31 + lVar27);
      uVar132 = (undefined1)((uint)uVar5 >> 0x18);
      uVar81 = (undefined1)((uint)uVar5 >> 0x10);
      uVar77 = (undefined1)((uint)uVar5 >> 8);
      uVar6 = *(undefined4 *)(puVar31 + lVar27 * 2);
      uVar75 = (undefined1)((uint)uVar6 >> 0x18);
      uVar73 = (undefined1)((uint)uVar6 >> 0x10);
      uVar71 = (undefined1)((uint)uVar6 >> 8);
      uVar7 = *(undefined4 *)(puVar31 + lVar27 * 3);
      uVar138 = (undefined1)((uint)uVar7 >> 0x18);
      uVar137 = (undefined1)((uint)uVar7 >> 0x10);
      uVar136 = (undefined1)((uint)uVar7 >> 8);
      uVar8 = *(undefined4 *)(puVar31 + lVar27 * 4);
      uVar133 = (undefined1)((uint)uVar8 >> 0x18);
      uVar83 = (undefined1)((uint)uVar8 >> 0x10);
      uVar79 = (undefined1)((uint)uVar8 >> 8);
      uVar9 = *(undefined4 *)(puVar31 + lVar27 * 5);
      uVar155 = (undefined1)((uint)uVar9 >> 0x18);
      uVar154 = (undefined1)((uint)uVar9 >> 0x10);
      uVar153 = (undefined1)((uint)uVar9 >> 8);
      uVar10 = *(undefined4 *)(puVar31 + lVar27 * 6);
      uVar30 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar155,uVar133),uVar154)
                                                         ,CONCAT14(uVar83,uVar8)) >> 0x20),uVar153),
                                 uVar79),CONCAT11((char)uVar9,(char)uVar8));
      local_1c8[0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar132,(char)((
                                                  uint)uVar4 >> 0x18)),uVar81),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar77),(char)((uint)uVar4 >> 8)),
                              CONCAT11((char)uVar5,(char)uVar4));
      local_1b8[0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar75,uVar132),
                                                                        uVar73),
                                                               CONCAT14(uVar81,uVar5)) >> 0x20),
                                                uVar71),uVar77),CONCAT11((char)uVar6,(char)uVar5));
      local_1a8[0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar138,uVar75),
                                                                        uVar137),
                                                               CONCAT14(uVar73,uVar6)) >> 0x20),
                                                uVar136),uVar71),CONCAT11((char)uVar7,(char)uVar6));
      local_198[0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar133,uVar138),
                                                                        uVar83),
                                                               CONCAT14(uVar137,uVar7)) >> 0x20),
                                                uVar79),uVar136),CONCAT11((char)uVar8,(char)uVar7));
      local_178[0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar10
                                                                                       >> 0x18),
                                                                                 uVar155),
                                                                        (char)((uint)uVar10 >> 0x10)
                                                                       ),CONCAT14(uVar154,uVar9)) >>
                                                     0x20),(char)((uint)uVar10 >> 8)),uVar153),
                              CONCAT11((char)uVar10,(char)uVar9));
      do {
        uVar85 = uVar30;
        lVar24 = local_178[0];
        lVar21 = local_198[0];
        lVar19 = local_1a8[0];
        local_188[1] = 0;
        local_1a8[1] = 0;
        local_1c8[1] = 0;
        local_1b8[1] = 0;
        local_178[1] = 0;
        local_198[1] = 0;
        uVar4 = *(undefined4 *)(puVar31 + lVar27 * 7);
        uVar75 = (undefined1)((uint)uVar4 >> 0x18);
        uVar73 = (undefined1)((uint)uVar4 >> 0x10);
        uVar71 = (undefined1)((uint)uVar4 >> 8);
        uVar30 = CONCAT62(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(uVar75,(char)((uint)uVar10 >>
                                                                                    0x18)),uVar73),
                                                     (char)((uint)uVar10 >> 0x10)),uVar71),
                                   (char)((uint)uVar10 >> 8)),CONCAT11((char)uVar4,(char)uVar10));
        _uStack_160 = 0;
        _local_168 = uVar30;
        uVar10 = *(undefined4 *)(puVar31 + lVar27 * 8);
        uVar1 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar10 >>
                                                                                  0x18),uVar75),
                                                                   (char)((uint)uVar10 >> 0x10)),
                                                          CONCAT14(uVar73,uVar4)) >> 0x20),
                                           (char)((uint)uVar10 >> 8)),uVar71),
                         CONCAT11((char)uVar10,(char)uVar4));
        local_158[1] = 0;
        local_158[0] = uVar1;
        local_188[0] = uVar85;
        convolve_lo_y(&local_1c8,(__m128i *)local_98);
        auVar38._0_4_ = extraout_XMM0_Da + 0x40 >> 7;
        auVar38._4_4_ = extraout_XMM0_Db + 0x40 >> 7;
        auVar38._8_4_ = extraout_XMM0_Dc + 0x40 >> 7;
        auVar38._12_4_ = extraout_XMM0_Dd + 0x40 >> 7;
        auVar108 = packssdw(auVar38,auVar38);
        sVar11 = auVar108._0_2_;
        sVar12 = auVar108._2_2_;
        uVar37 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar108[2] - (0xff < sVar12),
                          (0 < sVar11) * (sVar11 < 0x100) * auVar108[0] - (0xff < sVar11));
        sVar11 = auVar108._4_2_;
        sVar12 = auVar108._6_2_;
        if (w == 2) {
          *(undefined2 *)dst = uVar37;
        }
        else {
          *(uint *)dst = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar108[6] - (0xff < sVar12),
                                  CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar108[4] -
                                           (0xff < sVar11),uVar37));
        }
        puVar29 = dst + dst_stride;
        convolve_lo_y(&local_1b8,(__m128i *)local_98);
        auVar39._0_4_ = extraout_XMM0_Da_00 + 0x40 >> 7;
        auVar39._4_4_ = extraout_XMM0_Db_00 + 0x40 >> 7;
        auVar39._8_4_ = extraout_XMM0_Dc_00 + 0x40 >> 7;
        auVar39._12_4_ = extraout_XMM0_Dd_00 + 0x40 >> 7;
        auVar108 = packssdw(auVar39,auVar39);
        sVar11 = auVar108._0_2_;
        sVar12 = auVar108._2_2_;
        uVar37 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar108[2] - (0xff < sVar12),
                          (0 < sVar11) * (sVar11 < 0x100) * auVar108[0] - (0xff < sVar11));
        sVar11 = auVar108._4_2_;
        sVar12 = auVar108._6_2_;
        if (w == 2) {
          *(undefined2 *)puVar29 = uVar37;
        }
        else {
          *(uint *)puVar29 =
               CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar108[6] - (0xff < sVar12),
                        CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar108[4] - (0xff < sVar11),
                                 uVar37));
        }
        puVar31 = puVar31 + lVar27 * 2;
        dst = puVar29 + dst_stride;
        h = h + -2;
        local_1c8[0] = lVar19;
        local_1b8[0] = lVar21;
        local_1a8[0] = uVar85;
        local_198[0] = lVar24;
        local_178[0] = uVar1;
      } while (h != 0);
    }
    else {
      lVar32 = (long)src_stride;
      lVar28 = src_stride * 8 - lVar27;
      lVar27 = src_stride * 7 - lVar27;
      uVar30 = 0;
      local_108[0] = (long)dst_stride;
      do {
        puVar29 = puVar31 + lVar32 * 6 + uVar30;
        uVar36 = *puVar29;
        uVar72 = puVar29[1];
        uVar74 = puVar29[2];
        uVar76 = puVar29[3];
        uVar78 = puVar29[4];
        uVar80 = puVar29[5];
        uVar82 = puVar29[6];
        uVar84 = puVar29[7];
        uVar1 = *(ulong *)(puVar31 + uVar30);
        uVar85 = *(ulong *)(puVar31 + lVar32 + uVar30);
        uVar83 = (undefined1)(uVar85 >> 0x38);
        auVar61._8_6_ = 0;
        auVar61._0_8_ = uVar1;
        auVar61[0xe] = (char)(uVar1 >> 0x38);
        auVar61[0xf] = uVar83;
        auVar60._14_2_ = auVar61._14_2_;
        auVar60._8_5_ = 0;
        auVar60._0_8_ = uVar1;
        uVar81 = (undefined1)(uVar85 >> 0x30);
        auVar60[0xd] = uVar81;
        auVar59._13_3_ = auVar60._13_3_;
        auVar59._8_4_ = 0;
        auVar59._0_8_ = uVar1;
        auVar59[0xc] = (char)(uVar1 >> 0x30);
        auVar58._12_4_ = auVar59._12_4_;
        auVar58._8_3_ = 0;
        auVar58._0_8_ = uVar1;
        uVar79 = (undefined1)(uVar85 >> 0x28);
        auVar58[0xb] = uVar79;
        auVar57._11_5_ = auVar58._11_5_;
        auVar57._8_2_ = 0;
        auVar57._0_8_ = uVar1;
        auVar57[10] = (char)(uVar1 >> 0x28);
        auVar56._10_6_ = auVar57._10_6_;
        auVar56[8] = 0;
        auVar56._0_8_ = uVar1;
        uVar77 = (undefined1)(uVar85 >> 0x20);
        auVar56[9] = uVar77;
        auVar108._9_7_ = auVar56._9_7_;
        auVar108[8] = (char)(uVar1 >> 0x20);
        auVar108._0_8_ = uVar1;
        local_1c8[1] = auVar108._8_8_;
        uVar75 = (undefined1)(uVar85 >> 0x18);
        local_1c8[0]._7_1_ = uVar75;
        local_1c8[0]._6_1_ = (char)(uVar1 >> 0x18);
        uVar73 = (undefined1)(uVar85 >> 0x10);
        local_1c8[0]._5_1_ = uVar73;
        local_1c8[0]._4_1_ = (char)(uVar1 >> 0x10);
        uVar71 = (undefined1)(uVar85 >> 8);
        local_1c8[0]._3_1_ = uVar71;
        local_1c8[0]._2_1_ = (char)(uVar1 >> 8);
        local_1c8[0]._0_1_ = (undefined1)uVar1;
        local_1b8[0]._0_1_ = (undefined1)uVar85;
        local_1c8[0]._1_1_ = (undefined1)local_1b8[0];
        uVar1 = *(ulong *)(puVar31 + lVar32 * 2 + uVar30);
        uVar132 = (undefined1)(uVar1 >> 0x38);
        auVar115._8_6_ = 0;
        auVar115._0_8_ = uVar85;
        auVar115[0xe] = uVar83;
        auVar115[0xf] = uVar132;
        auVar114._14_2_ = auVar115._14_2_;
        auVar114._8_5_ = 0;
        auVar114._0_8_ = uVar85;
        uVar83 = (undefined1)(uVar1 >> 0x30);
        auVar114[0xd] = uVar83;
        auVar113._13_3_ = auVar114._13_3_;
        auVar113._8_4_ = 0;
        auVar113._0_8_ = uVar85;
        auVar113[0xc] = uVar81;
        auVar112._12_4_ = auVar113._12_4_;
        auVar112._8_3_ = 0;
        auVar112._0_8_ = uVar85;
        uVar81 = (undefined1)(uVar1 >> 0x28);
        auVar112[0xb] = uVar81;
        auVar111._11_5_ = auVar112._11_5_;
        auVar111._8_2_ = 0;
        auVar111._0_8_ = uVar85;
        auVar111[10] = uVar79;
        auVar110._10_6_ = auVar111._10_6_;
        auVar110[8] = 0;
        auVar110._0_8_ = uVar85;
        uVar79 = (undefined1)(uVar1 >> 0x20);
        auVar110[9] = uVar79;
        auVar109._9_7_ = auVar110._9_7_;
        auVar109[8] = uVar77;
        auVar109._0_8_ = uVar85;
        local_1b8[1] = auVar109._8_8_;
        uVar77 = (undefined1)(uVar1 >> 0x18);
        local_1b8[0]._7_1_ = uVar77;
        local_1b8[0]._6_1_ = uVar75;
        uVar75 = (undefined1)(uVar1 >> 0x10);
        local_1b8[0]._5_1_ = uVar75;
        local_1b8[0]._4_1_ = uVar73;
        uVar73 = (undefined1)(uVar1 >> 8);
        local_1b8[0]._3_1_ = uVar73;
        local_1b8[0]._2_1_ = uVar71;
        local_1a8[0]._0_1_ = (undefined1)uVar1;
        local_1b8[0]._1_1_ = (undefined1)local_1a8[0];
        uVar85 = *(ulong *)(puVar31 + lVar32 * 3 + uVar30);
        uVar153 = (undefined1)(uVar85 >> 0x38);
        auVar152._8_6_ = 0;
        auVar152._0_8_ = uVar1;
        auVar152[0xe] = uVar132;
        auVar152[0xf] = uVar153;
        auVar151._14_2_ = auVar152._14_2_;
        auVar151._8_5_ = 0;
        auVar151._0_8_ = uVar1;
        uVar138 = (undefined1)(uVar85 >> 0x30);
        auVar151[0xd] = uVar138;
        auVar150._13_3_ = auVar151._13_3_;
        auVar150._8_4_ = 0;
        auVar150._0_8_ = uVar1;
        auVar150[0xc] = uVar83;
        auVar149._12_4_ = auVar150._12_4_;
        auVar149._8_3_ = 0;
        auVar149._0_8_ = uVar1;
        uVar137 = (undefined1)(uVar85 >> 0x28);
        auVar149[0xb] = uVar137;
        auVar148._11_5_ = auVar149._11_5_;
        auVar148._8_2_ = 0;
        auVar148._0_8_ = uVar1;
        auVar148[10] = uVar81;
        auVar147._10_6_ = auVar148._10_6_;
        auVar147[8] = 0;
        auVar147._0_8_ = uVar1;
        uVar136 = (undefined1)(uVar85 >> 0x20);
        auVar147[9] = uVar136;
        auVar146._9_7_ = auVar147._9_7_;
        auVar146[8] = uVar79;
        auVar146._0_8_ = uVar1;
        local_1a8[1] = auVar146._8_8_;
        uVar133 = (undefined1)(uVar85 >> 0x18);
        local_1a8[0]._7_1_ = uVar133;
        local_1a8[0]._6_1_ = uVar77;
        uVar71 = (undefined1)(uVar85 >> 0x10);
        local_1a8[0]._5_1_ = uVar71;
        local_1a8[0]._4_1_ = uVar75;
        uVar132 = (undefined1)(uVar85 >> 8);
        local_1a8[0]._3_1_ = uVar132;
        local_1a8[0]._2_1_ = uVar73;
        local_198[0]._0_1_ = (undefined1)uVar85;
        local_1a8[0]._1_1_ = (undefined1)local_198[0];
        uVar1 = *(ulong *)(puVar31 + lVar32 * 4 + uVar30);
        uVar83 = (undefined1)(uVar1 >> 0x38);
        auVar169._8_6_ = 0;
        auVar169._0_8_ = uVar85;
        auVar169[0xe] = uVar153;
        auVar169[0xf] = uVar83;
        uVar81 = (undefined1)(uVar1 >> 0x30);
        auVar168._14_2_ = auVar169._14_2_;
        auVar168._8_5_ = 0;
        auVar168._0_8_ = uVar85;
        auVar168[0xd] = uVar81;
        auVar167._13_3_ = auVar168._13_3_;
        auVar167._8_4_ = 0;
        auVar167._0_8_ = uVar85;
        auVar167[0xc] = uVar138;
        uVar79 = (undefined1)(uVar1 >> 0x28);
        auVar166._12_4_ = auVar167._12_4_;
        auVar166._8_3_ = 0;
        auVar166._0_8_ = uVar85;
        auVar166[0xb] = uVar79;
        auVar165._11_5_ = auVar166._11_5_;
        auVar165._8_2_ = 0;
        auVar165._0_8_ = uVar85;
        auVar165[10] = uVar137;
        uVar77 = (undefined1)(uVar1 >> 0x20);
        auVar164._10_6_ = auVar165._10_6_;
        auVar164[8] = 0;
        auVar164._0_8_ = uVar85;
        auVar164[9] = uVar77;
        auVar163._9_7_ = auVar164._9_7_;
        auVar163[8] = uVar136;
        auVar163._0_8_ = uVar85;
        uVar75 = (undefined1)(uVar1 >> 0x18);
        local_198[1] = auVar163._8_8_;
        local_198[0]._7_1_ = uVar75;
        local_198[0]._6_1_ = uVar133;
        uVar73 = (undefined1)(uVar1 >> 0x10);
        local_198[0]._5_1_ = uVar73;
        local_198[0]._4_1_ = uVar71;
        uVar71 = (undefined1)(uVar1 >> 8);
        local_198[0]._3_1_ = uVar71;
        local_198[0]._2_1_ = uVar132;
        local_188[0]._0_1_ = (undefined1)uVar1;
        local_198[0]._1_1_ = (undefined1)local_188[0];
        uVar85 = *(ulong *)(puVar31 + lVar32 * 5 + uVar30);
        uVar132 = (undefined1)(uVar85 >> 0x38);
        auVar68._8_6_ = 0;
        auVar68._0_8_ = uVar1;
        auVar68[0xe] = uVar83;
        auVar68[0xf] = uVar132;
        auVar67._14_2_ = auVar68._14_2_;
        auVar67._8_5_ = 0;
        auVar67._0_8_ = uVar1;
        uVar83 = (undefined1)(uVar85 >> 0x30);
        auVar67[0xd] = uVar83;
        auVar66._13_3_ = auVar67._13_3_;
        auVar66._8_4_ = 0;
        auVar66._0_8_ = uVar1;
        auVar66[0xc] = uVar81;
        auVar65._12_4_ = auVar66._12_4_;
        auVar65._8_3_ = 0;
        auVar65._0_8_ = uVar1;
        uVar81 = (undefined1)(uVar85 >> 0x28);
        auVar65[0xb] = uVar81;
        auVar64._11_5_ = auVar65._11_5_;
        auVar64._8_2_ = 0;
        auVar64._0_8_ = uVar1;
        auVar64[10] = uVar79;
        auVar63._10_6_ = auVar64._10_6_;
        auVar63[8] = 0;
        auVar63._0_8_ = uVar1;
        uVar79 = (undefined1)(uVar85 >> 0x20);
        auVar63[9] = uVar79;
        auVar62._9_7_ = auVar63._9_7_;
        auVar62[8] = uVar77;
        auVar62._0_8_ = uVar1;
        local_188[1] = auVar62._8_8_;
        uVar77 = (undefined1)(uVar85 >> 0x18);
        local_188[0]._7_1_ = uVar77;
        local_188[0]._6_1_ = uVar75;
        uVar75 = (undefined1)(uVar85 >> 0x10);
        local_188[0]._5_1_ = uVar75;
        local_188[0]._4_1_ = uVar73;
        uVar73 = (undefined1)(uVar85 >> 8);
        local_188[0]._3_1_ = uVar73;
        local_188[0]._2_1_ = uVar71;
        local_178[0]._0_1_ = (undefined1)uVar85;
        local_188[0]._1_1_ = (undefined1)local_178[0];
        auVar122._8_6_ = 0;
        auVar122._0_8_ = uVar85;
        auVar122[0xe] = uVar132;
        auVar122[0xf] = uVar84;
        auVar121._14_2_ = auVar122._14_2_;
        auVar121._8_5_ = 0;
        auVar121._0_8_ = uVar85;
        auVar121[0xd] = uVar82;
        auVar120._13_3_ = auVar121._13_3_;
        auVar120._8_4_ = 0;
        auVar120._0_8_ = uVar85;
        auVar120[0xc] = uVar83;
        auVar119._12_4_ = auVar120._12_4_;
        auVar119._8_3_ = 0;
        auVar119._0_8_ = uVar85;
        auVar119[0xb] = uVar80;
        auVar118._11_5_ = auVar119._11_5_;
        auVar118._8_2_ = 0;
        auVar118._0_8_ = uVar85;
        auVar118[10] = uVar81;
        auVar117._10_6_ = auVar118._10_6_;
        auVar117[8] = 0;
        auVar117._0_8_ = uVar85;
        auVar117[9] = uVar78;
        auVar116._9_7_ = auVar117._9_7_;
        auVar116[8] = uVar79;
        auVar116._0_8_ = uVar85;
        local_178[1] = auVar116._8_8_;
        local_178[0]._7_1_ = uVar76;
        local_178[0]._6_1_ = uVar77;
        local_178[0]._5_1_ = uVar74;
        local_178[0]._4_1_ = uVar75;
        local_178[0]._3_1_ = uVar72;
        local_178[0]._2_1_ = uVar73;
        local_178[0]._1_1_ = uVar36;
        lVar34 = 0;
        local_e8[0] = lVar28;
        local_f8[0] = lVar27;
        puVar29 = dst;
        puVar33 = src;
        do {
          alVar25 = local_178;
          alVar23 = local_188;
          alVar22 = local_198;
          alVar20 = local_1a8;
          uVar1 = *(ulong *)(puVar33 + lVar27);
          uStack_209 = (undefined1)(uVar1 >> 0x38);
          uStack_20b = (undefined1)(uVar1 >> 0x30);
          uStack_20d = (undefined1)(uVar1 >> 0x28);
          uStack_20f = (undefined1)(uVar1 >> 0x20);
          uStack_211 = (undefined1)(uVar1 >> 0x18);
          uStack_213 = (undefined1)(uVar1 >> 0x10);
          uStack_215 = (undefined1)(uVar1 >> 8);
          alVar123[0]._0_1_ = (undefined1)uVar1;
          local_218[1] = (undefined1)alVar123[0];
          local_218[0] = uVar36;
          uStack_216 = uVar72;
          uStack_214 = uVar74;
          uStack_212 = uVar76;
          uStack_210 = uVar78;
          uStack_20e = uVar80;
          uStack_20c = uVar82;
          uStack_20a = uVar84;
          local_168[1] = (undefined1)alVar123[0];
          local_168[0] = uVar36;
          uStack_166 = uVar72;
          uStack_165 = uStack_215;
          uStack_164 = uVar74;
          uStack_163 = uStack_213;
          uStack_162 = uVar76;
          uStack_161 = uStack_211;
          uStack_160 = uVar78;
          uStack_15f = uStack_20f;
          uStack_15e = uVar80;
          uStack_15d = uStack_20d;
          uStack_15c = uVar82;
          uStack_15b = uStack_20b;
          uStack_15a = uVar84;
          uStack_159 = uStack_209;
          uVar2 = *(undefined8 *)(puVar33 + lVar28);
          uVar84 = (uint8_t)((ulong)uVar2 >> 0x38);
          auVar130._8_6_ = 0;
          auVar130._0_8_ = uVar1;
          auVar130[0xe] = uStack_209;
          auVar130[0xf] = uVar84;
          uVar82 = (uint8_t)((ulong)uVar2 >> 0x30);
          auVar129._14_2_ = auVar130._14_2_;
          auVar129._8_5_ = 0;
          auVar129._0_8_ = uVar1;
          auVar129[0xd] = uVar82;
          auVar128._13_3_ = auVar129._13_3_;
          auVar128._8_4_ = 0;
          auVar128._0_8_ = uVar1;
          auVar128[0xc] = uStack_20b;
          uVar80 = (uint8_t)((ulong)uVar2 >> 0x28);
          auVar127._12_4_ = auVar128._12_4_;
          auVar127._8_3_ = 0;
          auVar127._0_8_ = uVar1;
          auVar127[0xb] = uVar80;
          auVar126._11_5_ = auVar127._11_5_;
          auVar126._8_2_ = 0;
          auVar126._0_8_ = uVar1;
          auVar126[10] = uStack_20d;
          uVar78 = (uint8_t)((ulong)uVar2 >> 0x20);
          auVar125._10_6_ = auVar126._10_6_;
          auVar125[8] = 0;
          auVar125._0_8_ = uVar1;
          auVar125[9] = uVar78;
          auVar124._9_7_ = auVar125._9_7_;
          auVar124[8] = uStack_20f;
          auVar124._0_8_ = uVar1;
          uVar76 = (uint8_t)((ulong)uVar2 >> 0x18);
          alVar123[1] = auVar124._8_8_;
          alVar123[0]._7_1_ = uVar76;
          alVar123[0]._6_1_ = uStack_211;
          uVar74 = (uint8_t)((ulong)uVar2 >> 0x10);
          alVar123[0]._5_1_ = uVar74;
          alVar123[0]._4_1_ = uStack_213;
          uVar72 = (uint8_t)((ulong)uVar2 >> 8);
          alVar123[0]._3_1_ = uVar72;
          alVar123[0]._2_1_ = uStack_215;
          uVar36 = (uint8_t)uVar2;
          alVar123[0]._1_1_ = uVar36;
          local_158 = alVar123;
          convolve_lo_y(&local_1c8,(__m128i *)local_98);
          convolve_hi_y(&local_1c8,(__m128i *)local_98);
          local_298 = (int)extraout_XMM0_Qa_01;
          iStack_294 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          iStack_290 = (int)extraout_XMM0_Qb_01;
          iStack_28c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          auVar131._0_4_ = local_298 + 0x40 >> 7;
          auVar131._4_4_ = iStack_294 + 0x40 >> 7;
          auVar131._8_4_ = iStack_290 + 0x40 >> 7;
          auVar131._12_4_ = iStack_28c + 0x40 >> 7;
          auVar69._0_4_ = extraout_XMM0_Da_03 + 0x40 >> 7;
          auVar69._4_4_ = extraout_XMM0_Db_03 + 0x40 >> 7;
          auVar69._8_4_ = extraout_XMM0_Dc_03 + 0x40 >> 7;
          auVar69._12_4_ = extraout_XMM0_Dd_03 + 0x40 >> 7;
          auVar108 = packssdw(auVar131,auVar69);
          sVar11 = auVar108._0_2_;
          sVar12 = auVar108._2_2_;
          sVar13 = auVar108._4_2_;
          sVar14 = auVar108._6_2_;
          sVar15 = auVar108._8_2_;
          sVar16 = auVar108._10_2_;
          sVar17 = auVar108._12_2_;
          sVar18 = auVar108._14_2_;
          *(ulong *)puVar29 =
               CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar108[0xe] - (0xff < sVar18),
                        CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar108[0xc] - (0xff < sVar17),
                                 CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar108[10] -
                                          (0xff < sVar16),
                                          CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar108[8] -
                                                   (0xff < sVar15),
                                                   CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                            auVar108[6] - (0xff < sVar14),
                                                            CONCAT12((0 < sVar13) * (sVar13 < 0x100)
                                                                     * auVar108[4] - (0xff < sVar13)
                                                                     ,CONCAT11((0 < sVar12) *
                                                                               (sVar12 < 0x100) *
                                                                               auVar108[2] -
                                                                               (0xff < sVar12),
                                                                               (0 < sVar11) *
                                                                               (sVar11 < 0x100) *
                                                                               auVar108[0] -
                                                                               (0xff < sVar11)))))))
                       );
          convolve_lo_y(&local_1b8,(__m128i *)local_98);
          convolve_hi_y(&local_1b8,(__m128i *)local_98);
          local_298 = (int)extraout_XMM0_Qa_02;
          iStack_294 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
          iStack_290 = (int)extraout_XMM0_Qb_02;
          iStack_28c = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
          auVar135._0_4_ = local_298 + 0x40 >> 7;
          auVar135._4_4_ = iStack_294 + 0x40 >> 7;
          auVar135._8_4_ = iStack_290 + 0x40 >> 7;
          auVar135._12_4_ = iStack_28c + 0x40 >> 7;
          auVar70._0_4_ = extraout_XMM0_Da_04 + 0x40 >> 7;
          auVar70._4_4_ = extraout_XMM0_Db_04 + 0x40 >> 7;
          auVar70._8_4_ = extraout_XMM0_Dc_04 + 0x40 >> 7;
          auVar70._12_4_ = extraout_XMM0_Dd_04 + 0x40 >> 7;
          auVar108 = packssdw(auVar135,auVar70);
          sVar11 = auVar108._0_2_;
          sVar12 = auVar108._2_2_;
          sVar13 = auVar108._4_2_;
          sVar14 = auVar108._6_2_;
          sVar15 = auVar108._8_2_;
          sVar16 = auVar108._10_2_;
          sVar17 = auVar108._12_2_;
          sVar18 = auVar108._14_2_;
          *(ulong *)(puVar29 + local_108[0]) =
               CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar108[0xe] - (0xff < sVar18),
                        CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar108[0xc] - (0xff < sVar17),
                                 CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar108[10] -
                                          (0xff < sVar16),
                                          CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar108[8] -
                                                   (0xff < sVar15),
                                                   CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                            auVar108[6] - (0xff < sVar14),
                                                            CONCAT12((0 < sVar13) * (sVar13 < 0x100)
                                                                     * auVar108[4] - (0xff < sVar13)
                                                                     ,CONCAT11((0 < sVar12) *
                                                                               (sVar12 < 0x100) *
                                                                               auVar108[2] -
                                                                               (0xff < sVar12),
                                                                               (0 < sVar11) *
                                                                               (sVar11 < 0x100) *
                                                                               auVar108[0] -
                                                                               (0xff < sVar11)))))))
                       );
          lVar34 = lVar34 + 2;
          local_188[0] = _local_218;
          local_188[1] = _uStack_210;
          puVar29 = puVar29 + (long)dst_stride * 2;
          puVar33 = puVar33 + lVar32 * 2;
          lVar27 = local_f8[0];
          lVar28 = local_e8[0];
          local_1c8 = alVar20;
          local_1b8 = alVar22;
          local_1a8 = alVar23;
          local_198 = alVar25;
          local_178 = alVar123;
        } while (lVar34 < h);
        uVar30 = uVar30 + 8;
        dst = dst + 8;
        lVar28 = local_e8[0] + 8;
        lVar27 = local_f8[0] + 8;
      } while (uVar30 < (uint)w);
    }
  }
  else {
    if (w < 8) {
      av1_convolve_y_sr_c(src,src_stride,dst,dst_stride,w,h,filter_params_y,subpel_y_qn);
      return;
    }
    lVar28 = (long)(int)(((uVar3 >> 1) - 1) * src_stride);
    prepare_coeffs_12tap(filter_params_y,subpel_y_qn,(__m128i *)local_98);
    lVar27 = (long)src_stride;
    local_a0 = lVar27 * 10;
    local_a8 = lVar27 * 3;
    local_b0 = lVar27 * 5;
    local_b8 = lVar27 * 6;
    local_c0 = lVar27 * 7;
    local_c8 = lVar27 * 9;
    local_d0 = (ulong)(uint)w;
    lVar34 = src_stride * 0xc - lVar28;
    lVar32 = src_stride * 0xb - lVar28;
    uVar30 = 0;
    do {
      lVar35 = uVar30 - lVar28;
      puVar31 = src + local_a0 + lVar35;
      uVar1 = *(ulong *)(src + (uVar30 - lVar28));
      uVar85 = *(ulong *)(src + lVar27 + lVar35);
      uVar83 = (undefined1)(uVar85 >> 0x38);
      auVar46._8_6_ = 0;
      auVar46._0_8_ = uVar1;
      auVar46[0xe] = (char)(uVar1 >> 0x38);
      auVar46[0xf] = uVar83;
      auVar45._14_2_ = auVar46._14_2_;
      auVar45._8_5_ = 0;
      auVar45._0_8_ = uVar1;
      uVar81 = (undefined1)(uVar85 >> 0x30);
      auVar45[0xd] = uVar81;
      auVar44._13_3_ = auVar45._13_3_;
      auVar44._8_4_ = 0;
      auVar44._0_8_ = uVar1;
      auVar44[0xc] = (char)(uVar1 >> 0x30);
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._8_3_ = 0;
      auVar43._0_8_ = uVar1;
      uVar79 = (undefined1)(uVar85 >> 0x28);
      auVar43[0xb] = uVar79;
      auVar42._11_5_ = auVar43._11_5_;
      auVar42._8_2_ = 0;
      auVar42._0_8_ = uVar1;
      auVar42[10] = (char)(uVar1 >> 0x28);
      auVar41._10_6_ = auVar42._10_6_;
      auVar41[8] = 0;
      auVar41._0_8_ = uVar1;
      uVar77 = (undefined1)(uVar85 >> 0x20);
      auVar41[9] = uVar77;
      auVar40._9_7_ = auVar41._9_7_;
      auVar40[8] = (char)(uVar1 >> 0x20);
      auVar40._0_8_ = uVar1;
      local_1c8[1] = auVar40._8_8_;
      uVar75 = (undefined1)(uVar85 >> 0x18);
      local_1c8[0]._7_1_ = uVar75;
      local_1c8[0]._6_1_ = (char)(uVar1 >> 0x18);
      uVar73 = (undefined1)(uVar85 >> 0x10);
      local_1c8[0]._5_1_ = uVar73;
      local_1c8[0]._4_1_ = (char)(uVar1 >> 0x10);
      uVar71 = (undefined1)(uVar85 >> 8);
      local_1c8[0]._3_1_ = uVar71;
      local_1c8[0]._2_1_ = (char)(uVar1 >> 8);
      local_1c8[0]._0_1_ = (undefined1)uVar1;
      local_1b8[0]._0_1_ = (undefined1)uVar85;
      local_1c8[0]._1_1_ = (undefined1)local_1b8[0];
      uVar1 = *(ulong *)(src + lVar27 * 2 + lVar35);
      uVar132 = (undefined1)(uVar1 >> 0x38);
      auVar92._8_6_ = 0;
      auVar92._0_8_ = uVar85;
      auVar92[0xe] = uVar83;
      auVar92[0xf] = uVar132;
      auVar91._14_2_ = auVar92._14_2_;
      auVar91._8_5_ = 0;
      auVar91._0_8_ = uVar85;
      uVar83 = (undefined1)(uVar1 >> 0x30);
      auVar91[0xd] = uVar83;
      auVar90._13_3_ = auVar91._13_3_;
      auVar90._8_4_ = 0;
      auVar90._0_8_ = uVar85;
      auVar90[0xc] = uVar81;
      auVar89._12_4_ = auVar90._12_4_;
      auVar89._8_3_ = 0;
      auVar89._0_8_ = uVar85;
      uVar81 = (undefined1)(uVar1 >> 0x28);
      auVar89[0xb] = uVar81;
      auVar88._11_5_ = auVar89._11_5_;
      auVar88._8_2_ = 0;
      auVar88._0_8_ = uVar85;
      auVar88[10] = uVar79;
      auVar87._10_6_ = auVar88._10_6_;
      auVar87[8] = 0;
      auVar87._0_8_ = uVar85;
      uVar79 = (undefined1)(uVar1 >> 0x20);
      auVar87[9] = uVar79;
      auVar86._9_7_ = auVar87._9_7_;
      auVar86[8] = uVar77;
      auVar86._0_8_ = uVar85;
      local_1b8[1] = auVar86._8_8_;
      uVar77 = (undefined1)(uVar1 >> 0x18);
      local_1b8[0]._7_1_ = uVar77;
      local_1b8[0]._6_1_ = uVar75;
      uVar75 = (undefined1)(uVar1 >> 0x10);
      local_1b8[0]._5_1_ = uVar75;
      local_1b8[0]._4_1_ = uVar73;
      uVar73 = (undefined1)(uVar1 >> 8);
      local_1b8[0]._3_1_ = uVar73;
      local_1b8[0]._2_1_ = uVar71;
      local_1a8[0]._0_1_ = (undefined1)uVar1;
      local_1b8[0]._1_1_ = (undefined1)local_1a8[0];
      uVar85 = *(ulong *)(src + local_a8 + lVar35);
      uVar153 = (undefined1)(uVar85 >> 0x38);
      auVar183._8_6_ = 0;
      auVar183._0_8_ = uVar1;
      auVar183[0xe] = uVar132;
      auVar183[0xf] = uVar153;
      auVar182._14_2_ = auVar183._14_2_;
      auVar182._8_5_ = 0;
      auVar182._0_8_ = uVar1;
      uVar138 = (undefined1)(uVar85 >> 0x30);
      auVar182[0xd] = uVar138;
      auVar181._13_3_ = auVar182._13_3_;
      auVar181._8_4_ = 0;
      auVar181._0_8_ = uVar1;
      auVar181[0xc] = uVar83;
      auVar180._12_4_ = auVar181._12_4_;
      auVar180._8_3_ = 0;
      auVar180._0_8_ = uVar1;
      uVar137 = (undefined1)(uVar85 >> 0x28);
      auVar180[0xb] = uVar137;
      auVar179._11_5_ = auVar180._11_5_;
      auVar179._8_2_ = 0;
      auVar179._0_8_ = uVar1;
      auVar179[10] = uVar81;
      auVar178._10_6_ = auVar179._10_6_;
      auVar178[8] = 0;
      auVar178._0_8_ = uVar1;
      uVar136 = (undefined1)(uVar85 >> 0x20);
      auVar178[9] = uVar136;
      auVar177._9_7_ = auVar178._9_7_;
      auVar177[8] = uVar79;
      auVar177._0_8_ = uVar1;
      local_1a8[1] = auVar177._8_8_;
      uVar133 = (undefined1)(uVar85 >> 0x18);
      local_1a8[0]._7_1_ = uVar133;
      local_1a8[0]._6_1_ = uVar77;
      uVar71 = (undefined1)(uVar85 >> 0x10);
      local_1a8[0]._5_1_ = uVar71;
      local_1a8[0]._4_1_ = uVar75;
      uVar132 = (undefined1)(uVar85 >> 8);
      local_1a8[0]._3_1_ = uVar132;
      local_1a8[0]._2_1_ = uVar73;
      local_198[0]._0_1_ = (undefined1)uVar85;
      local_1a8[0]._1_1_ = (undefined1)local_198[0];
      uVar1 = *(ulong *)(src + lVar27 * 4 + lVar35);
      uVar83 = (undefined1)(uVar1 >> 0x38);
      auVar190._8_6_ = 0;
      auVar190._0_8_ = uVar85;
      auVar190[0xe] = uVar153;
      auVar190[0xf] = uVar83;
      uVar81 = (undefined1)(uVar1 >> 0x30);
      auVar189._14_2_ = auVar190._14_2_;
      auVar189._8_5_ = 0;
      auVar189._0_8_ = uVar85;
      auVar189[0xd] = uVar81;
      auVar188._13_3_ = auVar189._13_3_;
      auVar188._8_4_ = 0;
      auVar188._0_8_ = uVar85;
      auVar188[0xc] = uVar138;
      uVar79 = (undefined1)(uVar1 >> 0x28);
      auVar187._12_4_ = auVar188._12_4_;
      auVar187._8_3_ = 0;
      auVar187._0_8_ = uVar85;
      auVar187[0xb] = uVar79;
      auVar186._11_5_ = auVar187._11_5_;
      auVar186._8_2_ = 0;
      auVar186._0_8_ = uVar85;
      auVar186[10] = uVar137;
      uVar77 = (undefined1)(uVar1 >> 0x20);
      auVar185._10_6_ = auVar186._10_6_;
      auVar185[8] = 0;
      auVar185._0_8_ = uVar85;
      auVar185[9] = uVar77;
      auVar184._9_7_ = auVar185._9_7_;
      auVar184[8] = uVar136;
      auVar184._0_8_ = uVar85;
      uVar75 = (undefined1)(uVar1 >> 0x18);
      local_198[1] = auVar184._8_8_;
      local_198[0]._7_1_ = uVar75;
      local_198[0]._6_1_ = uVar133;
      uVar73 = (undefined1)(uVar1 >> 0x10);
      local_198[0]._5_1_ = uVar73;
      local_198[0]._4_1_ = uVar71;
      uVar71 = (undefined1)(uVar1 >> 8);
      local_198[0]._3_1_ = uVar71;
      local_198[0]._2_1_ = uVar132;
      local_188[0]._0_1_ = (undefined1)uVar1;
      local_198[0]._1_1_ = (undefined1)local_188[0];
      uVar85 = *(ulong *)(src + local_b0 + lVar35);
      uVar132 = (undefined1)(uVar85 >> 0x38);
      auVar99._8_6_ = 0;
      auVar99._0_8_ = uVar1;
      auVar99[0xe] = uVar83;
      auVar99[0xf] = uVar132;
      auVar98._14_2_ = auVar99._14_2_;
      auVar98._8_5_ = 0;
      auVar98._0_8_ = uVar1;
      uVar83 = (undefined1)(uVar85 >> 0x30);
      auVar98[0xd] = uVar83;
      auVar97._13_3_ = auVar98._13_3_;
      auVar97._8_4_ = 0;
      auVar97._0_8_ = uVar1;
      auVar97[0xc] = uVar81;
      auVar96._12_4_ = auVar97._12_4_;
      auVar96._8_3_ = 0;
      auVar96._0_8_ = uVar1;
      uVar81 = (undefined1)(uVar85 >> 0x28);
      auVar96[0xb] = uVar81;
      auVar95._11_5_ = auVar96._11_5_;
      auVar95._8_2_ = 0;
      auVar95._0_8_ = uVar1;
      auVar95[10] = uVar79;
      auVar94._10_6_ = auVar95._10_6_;
      auVar94[8] = 0;
      auVar94._0_8_ = uVar1;
      uVar79 = (undefined1)(uVar85 >> 0x20);
      auVar94[9] = uVar79;
      auVar93._9_7_ = auVar94._9_7_;
      auVar93[8] = uVar77;
      auVar93._0_8_ = uVar1;
      local_188[1] = auVar93._8_8_;
      uVar77 = (undefined1)(uVar85 >> 0x18);
      local_188[0]._7_1_ = uVar77;
      local_188[0]._6_1_ = uVar75;
      uVar75 = (undefined1)(uVar85 >> 0x10);
      local_188[0]._5_1_ = uVar75;
      local_188[0]._4_1_ = uVar73;
      uVar73 = (undefined1)(uVar85 >> 8);
      local_188[0]._3_1_ = uVar73;
      local_188[0]._2_1_ = uVar71;
      local_178[0]._0_1_ = (undefined1)uVar85;
      local_188[0]._1_1_ = (undefined1)local_178[0];
      uVar1 = *(ulong *)(src + local_b8 + lVar35);
      uVar133 = (undefined1)(uVar1 >> 0x38);
      auVar145._8_6_ = 0;
      auVar145._0_8_ = uVar85;
      auVar145[0xe] = uVar132;
      auVar145[0xf] = uVar133;
      auVar144._14_2_ = auVar145._14_2_;
      auVar144._8_5_ = 0;
      auVar144._0_8_ = uVar85;
      uVar132 = (undefined1)(uVar1 >> 0x30);
      auVar144[0xd] = uVar132;
      auVar143._13_3_ = auVar144._13_3_;
      auVar143._8_4_ = 0;
      auVar143._0_8_ = uVar85;
      auVar143[0xc] = uVar83;
      auVar142._12_4_ = auVar143._12_4_;
      auVar142._8_3_ = 0;
      auVar142._0_8_ = uVar85;
      uVar83 = (undefined1)(uVar1 >> 0x28);
      auVar142[0xb] = uVar83;
      auVar141._11_5_ = auVar142._11_5_;
      auVar141._8_2_ = 0;
      auVar141._0_8_ = uVar85;
      auVar141[10] = uVar81;
      auVar140._10_6_ = auVar141._10_6_;
      auVar140[8] = 0;
      auVar140._0_8_ = uVar85;
      uVar81 = (undefined1)(uVar1 >> 0x20);
      auVar140[9] = uVar81;
      auVar139._9_7_ = auVar140._9_7_;
      auVar139[8] = uVar79;
      auVar139._0_8_ = uVar85;
      local_178[1] = auVar139._8_8_;
      uVar79 = (undefined1)(uVar1 >> 0x18);
      local_178[0]._7_1_ = uVar79;
      local_178[0]._6_1_ = uVar77;
      uVar77 = (undefined1)(uVar1 >> 0x10);
      local_178[0]._5_1_ = uVar77;
      local_178[0]._4_1_ = uVar75;
      uVar71 = (undefined1)(uVar1 >> 8);
      local_178[0]._3_1_ = uVar71;
      local_178[0]._2_1_ = uVar73;
      local_168[0] = (undefined1)uVar1;
      local_178[0]._1_1_ = local_168[0];
      uVar85 = *(ulong *)(src + local_c0 + lVar35);
      uVar138 = (undefined1)(uVar85 >> 0x38);
      auVar162._8_6_ = 0;
      auVar162._0_8_ = uVar1;
      auVar162[0xe] = uVar133;
      auVar162[0xf] = uVar138;
      auVar161._14_2_ = auVar162._14_2_;
      auVar161._8_5_ = 0;
      auVar161._0_8_ = uVar1;
      uVar137 = (undefined1)(uVar85 >> 0x30);
      auVar161[0xd] = uVar137;
      auVar160._13_3_ = auVar161._13_3_;
      auVar160._8_4_ = 0;
      auVar160._0_8_ = uVar1;
      auVar160[0xc] = uVar132;
      auVar159._12_4_ = auVar160._12_4_;
      auVar159._8_3_ = 0;
      auVar159._0_8_ = uVar1;
      uVar136 = (undefined1)(uVar85 >> 0x28);
      auVar159[0xb] = uVar136;
      auVar158._11_5_ = auVar159._11_5_;
      auVar158._8_2_ = 0;
      auVar158._0_8_ = uVar1;
      auVar158[10] = uVar83;
      auVar157._10_6_ = auVar158._10_6_;
      auVar157[8] = 0;
      auVar157._0_8_ = uVar1;
      uVar75 = (undefined1)(uVar85 >> 0x20);
      auVar157[9] = uVar75;
      auVar156._9_7_ = auVar157._9_7_;
      auVar156[8] = uVar81;
      auVar156._0_8_ = uVar1;
      _uStack_160 = auVar156._8_8_;
      uVar73 = (undefined1)(uVar85 >> 0x18);
      uStack_161 = uVar73;
      uStack_162 = uVar79;
      uVar133 = (undefined1)(uVar85 >> 0x10);
      uStack_163 = uVar133;
      uStack_164 = uVar77;
      uVar132 = (undefined1)(uVar85 >> 8);
      uStack_165 = uVar132;
      uStack_166 = uVar71;
      local_158[0]._0_1_ = (undefined1)uVar85;
      local_168[1] = (undefined1)local_158[0];
      uVar1 = *(ulong *)(src + lVar27 * 8 + lVar35);
      uVar83 = (undefined1)(uVar1 >> 0x38);
      auVar176._8_6_ = 0;
      auVar176._0_8_ = uVar85;
      auVar176[0xe] = uVar138;
      auVar176[0xf] = uVar83;
      uVar81 = (undefined1)(uVar1 >> 0x30);
      auVar175._14_2_ = auVar176._14_2_;
      auVar175._8_5_ = 0;
      auVar175._0_8_ = uVar85;
      auVar175[0xd] = uVar81;
      auVar174._13_3_ = auVar175._13_3_;
      auVar174._8_4_ = 0;
      auVar174._0_8_ = uVar85;
      auVar174[0xc] = uVar137;
      uVar79 = (undefined1)(uVar1 >> 0x28);
      auVar173._12_4_ = auVar174._12_4_;
      auVar173._8_3_ = 0;
      auVar173._0_8_ = uVar85;
      auVar173[0xb] = uVar79;
      auVar172._11_5_ = auVar173._11_5_;
      auVar172._8_2_ = 0;
      auVar172._0_8_ = uVar85;
      auVar172[10] = uVar136;
      uVar77 = (undefined1)(uVar1 >> 0x20);
      auVar171._10_6_ = auVar172._10_6_;
      auVar171[8] = 0;
      auVar171._0_8_ = uVar85;
      auVar171[9] = uVar77;
      auVar170._9_7_ = auVar171._9_7_;
      auVar170[8] = uVar75;
      auVar170._0_8_ = uVar85;
      uVar75 = (undefined1)(uVar1 >> 0x18);
      local_158[1] = auVar170._8_8_;
      local_158[0]._7_1_ = uVar75;
      local_158[0]._6_1_ = uVar73;
      uVar73 = (undefined1)(uVar1 >> 0x10);
      local_158[0]._5_1_ = uVar73;
      local_158[0]._4_1_ = uVar133;
      uVar71 = (undefined1)(uVar1 >> 8);
      local_158[0]._3_1_ = uVar71;
      local_158[0]._2_1_ = uVar132;
      local_148[0]._0_1_ = (undefined1)uVar1;
      local_158[0]._1_1_ = (undefined1)local_148[0];
      uVar85 = *(ulong *)(src + local_c8 + lVar35);
      uVar132 = (undefined1)(uVar85 >> 0x38);
      auVar53._8_6_ = 0;
      auVar53._0_8_ = uVar1;
      auVar53[0xe] = uVar83;
      auVar53[0xf] = uVar132;
      auVar52._14_2_ = auVar53._14_2_;
      auVar52._8_5_ = 0;
      auVar52._0_8_ = uVar1;
      uVar83 = (undefined1)(uVar85 >> 0x30);
      auVar52[0xd] = uVar83;
      auVar51._13_3_ = auVar52._13_3_;
      auVar51._8_4_ = 0;
      auVar51._0_8_ = uVar1;
      auVar51[0xc] = uVar81;
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._8_3_ = 0;
      auVar50._0_8_ = uVar1;
      uVar81 = (undefined1)(uVar85 >> 0x28);
      auVar50[0xb] = uVar81;
      auVar49._11_5_ = auVar50._11_5_;
      auVar49._8_2_ = 0;
      auVar49._0_8_ = uVar1;
      auVar49[10] = uVar79;
      auVar48._10_6_ = auVar49._10_6_;
      auVar48[8] = 0;
      auVar48._0_8_ = uVar1;
      uVar79 = (undefined1)(uVar85 >> 0x20);
      auVar48[9] = uVar79;
      auVar47._9_7_ = auVar48._9_7_;
      auVar47[8] = uVar77;
      auVar47._0_8_ = uVar1;
      local_148[1] = auVar47._8_8_;
      uVar77 = (undefined1)(uVar85 >> 0x18);
      local_148[0]._7_1_ = uVar77;
      local_148[0]._6_1_ = uVar75;
      uVar75 = (undefined1)(uVar85 >> 0x10);
      local_148[0]._5_1_ = uVar75;
      local_148[0]._4_1_ = uVar73;
      uVar73 = (undefined1)(uVar85 >> 8);
      local_148[0]._3_1_ = uVar73;
      local_148[0]._2_1_ = uVar71;
      local_138[0]._0_1_ = (undefined1)uVar85;
      local_148[0]._1_1_ = (undefined1)local_138[0];
      auVar197._8_6_ = 0;
      auVar197._0_8_ = uVar85;
      auVar197[0xe] = uVar132;
      auVar197[0xf] = puVar31[7];
      auVar196._14_2_ = auVar197._14_2_;
      auVar196._8_5_ = 0;
      auVar196._0_8_ = uVar85;
      auVar196[0xd] = puVar31[6];
      auVar195._13_3_ = auVar196._13_3_;
      auVar195._8_4_ = 0;
      auVar195._0_8_ = uVar85;
      auVar195[0xc] = uVar83;
      auVar194._12_4_ = auVar195._12_4_;
      auVar194._8_3_ = 0;
      auVar194._0_8_ = uVar85;
      auVar194[0xb] = puVar31[5];
      auVar193._11_5_ = auVar194._11_5_;
      auVar193._8_2_ = 0;
      auVar193._0_8_ = uVar85;
      auVar193[10] = uVar81;
      auVar192._10_6_ = auVar193._10_6_;
      auVar192[8] = 0;
      auVar192._0_8_ = uVar85;
      auVar192[9] = puVar31[4];
      auVar191._9_7_ = auVar192._9_7_;
      auVar191[8] = uVar79;
      auVar191._0_8_ = uVar85;
      local_138[1] = auVar191._8_8_;
      local_138[0]._7_1_ = puVar31[3];
      local_138[0]._6_1_ = uVar77;
      local_138[0]._5_1_ = puVar31[2];
      local_138[0]._4_1_ = uVar75;
      local_138[0]._3_1_ = puVar31[1];
      local_138[0]._2_1_ = uVar73;
      local_138[0]._1_1_ = *puVar31;
      lVar35 = 0;
      puVar29 = src;
      puVar33 = dst;
      local_128 = *puVar31;
      uStack_126 = puVar31[1];
      uStack_124 = puVar31[2];
      uStack_122 = puVar31[3];
      uStack_120 = puVar31[4];
      uStack_11e = puVar31[5];
      uStack_11c = puVar31[6];
      uStack_11a = puVar31[7];
      do {
        alVar26 = local_158;
        alVar123 = _local_168;
        alVar25 = local_178;
        alVar23 = local_188;
        alVar22 = local_198;
        alVar20 = local_1a8;
        uVar1 = *(ulong *)(puVar29 + lVar32);
        uStack_119 = (undefined1)(uVar1 >> 0x38);
        uStack_11b = (undefined1)(uVar1 >> 0x30);
        uStack_11d = (undefined1)(uVar1 >> 0x28);
        uStack_11f = (undefined1)(uVar1 >> 0x20);
        uStack_121 = (undefined1)(uVar1 >> 0x18);
        uStack_123 = (undefined1)(uVar1 >> 0x10);
        uStack_125 = (undefined1)(uVar1 >> 8);
        local_118[0]._0_1_ = (undefined1)uVar1;
        local_228[1] = (undefined1)local_118[0];
        local_228[0] = local_128;
        uStack_226 = uStack_126;
        uStack_225 = uStack_125;
        uStack_224 = uStack_124;
        uStack_223 = uStack_123;
        uStack_222 = uStack_122;
        uStack_221 = uStack_121;
        uStack_220 = uStack_120;
        uStack_21f = uStack_11f;
        uStack_21e = uStack_11e;
        uStack_21d = uStack_11d;
        uStack_21c = uStack_11c;
        uStack_21b = uStack_11b;
        uStack_21a = uStack_11a;
        uStack_219 = uStack_119;
        uVar2 = *(undefined8 *)(puVar29 + lVar34);
        uVar82 = (uint8_t)((ulong)uVar2 >> 0x38);
        auVar106._8_6_ = 0;
        auVar106._0_8_ = uVar1;
        auVar106[0xe] = uStack_119;
        auVar106[0xf] = uVar82;
        uVar80 = (uint8_t)((ulong)uVar2 >> 0x30);
        auVar105._14_2_ = auVar106._14_2_;
        auVar105._8_5_ = 0;
        auVar105._0_8_ = uVar1;
        auVar105[0xd] = uVar80;
        auVar104._13_3_ = auVar105._13_3_;
        auVar104._8_4_ = 0;
        auVar104._0_8_ = uVar1;
        auVar104[0xc] = uStack_11b;
        uVar78 = (uint8_t)((ulong)uVar2 >> 0x28);
        auVar103._12_4_ = auVar104._12_4_;
        auVar103._8_3_ = 0;
        auVar103._0_8_ = uVar1;
        auVar103[0xb] = uVar78;
        auVar102._11_5_ = auVar103._11_5_;
        auVar102._8_2_ = 0;
        auVar102._0_8_ = uVar1;
        auVar102[10] = uStack_11d;
        uVar76 = (uint8_t)((ulong)uVar2 >> 0x20);
        auVar101._10_6_ = auVar102._10_6_;
        auVar101[8] = 0;
        auVar101._0_8_ = uVar1;
        auVar101[9] = uVar76;
        auVar100._9_7_ = auVar101._9_7_;
        auVar100[8] = uStack_11f;
        auVar100._0_8_ = uVar1;
        uVar74 = (uint8_t)((ulong)uVar2 >> 0x18);
        local_118[1] = auVar100._8_8_;
        local_118[0]._7_1_ = uVar74;
        local_118[0]._6_1_ = uStack_121;
        uVar72 = (uint8_t)((ulong)uVar2 >> 0x10);
        local_118[0]._5_1_ = uVar72;
        local_118[0]._4_1_ = uStack_123;
        uVar36 = (uint8_t)((ulong)uVar2 >> 8);
        local_118[0]._3_1_ = uVar36;
        local_118[0]._2_1_ = uStack_125;
        local_118[0]._1_1_ = (uint8_t)uVar2;
        uStack_127 = (undefined1)local_118[0];
        local_108 = local_118;
        local_f8 = local_138;
        local_e8 = local_148;
        convolve_lo_y_12tap(&local_1c8,(__m128i *)local_98);
        convolve_hi_y_12tap(&local_1c8,(__m128i *)local_98);
        local_1f8 = (int)extraout_XMM0_Qa;
        iStack_1f4 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_1f0 = (int)extraout_XMM0_Qb;
        iStack_1ec = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar107._0_4_ = local_1f8 + 0x40 >> 7;
        auVar107._4_4_ = iStack_1f4 + 0x40 >> 7;
        auVar107._8_4_ = iStack_1f0 + 0x40 >> 7;
        auVar107._12_4_ = iStack_1ec + 0x40 >> 7;
        auVar54._0_4_ = extraout_XMM0_Da_01 + 0x40 >> 7;
        auVar54._4_4_ = extraout_XMM0_Db_01 + 0x40 >> 7;
        auVar54._8_4_ = extraout_XMM0_Dc_01 + 0x40 >> 7;
        auVar54._12_4_ = extraout_XMM0_Dd_01 + 0x40 >> 7;
        auVar108 = packssdw(auVar107,auVar54);
        sVar11 = auVar108._0_2_;
        sVar12 = auVar108._2_2_;
        sVar13 = auVar108._4_2_;
        sVar14 = auVar108._6_2_;
        sVar15 = auVar108._8_2_;
        sVar16 = auVar108._10_2_;
        sVar17 = auVar108._12_2_;
        sVar18 = auVar108._14_2_;
        *(ulong *)puVar33 =
             CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar108[0xe] - (0xff < sVar18),
                      CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar108[0xc] - (0xff < sVar17),
                               CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar108[10] -
                                        (0xff < sVar16),
                                        CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar108[8] -
                                                 (0xff < sVar15),
                                                 CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                          auVar108[6] - (0xff < sVar14),
                                                          CONCAT12((0 < sVar13) * (sVar13 < 0x100) *
                                                                   auVar108[4] - (0xff < sVar13),
                                                                   CONCAT11((0 < sVar12) *
                                                                            (sVar12 < 0x100) *
                                                                            auVar108[2] -
                                                                            (0xff < sVar12),
                                                                            (0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar108[0] -
                                                                            (0xff < sVar11))))))));
        convolve_lo_y_12tap(&local_1b8,(__m128i *)local_98);
        convolve_hi_y_12tap(&local_1b8,(__m128i *)local_98);
        local_1f8 = (int)extraout_XMM0_Qa_00;
        iStack_1f4 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        iStack_1f0 = (int)extraout_XMM0_Qb_00;
        iStack_1ec = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        auVar134._0_4_ = local_1f8 + 0x40 >> 7;
        auVar134._4_4_ = iStack_1f4 + 0x40 >> 7;
        auVar134._8_4_ = iStack_1f0 + 0x40 >> 7;
        auVar134._12_4_ = iStack_1ec + 0x40 >> 7;
        auVar55._0_4_ = extraout_XMM0_Da_02 + 0x40 >> 7;
        auVar55._4_4_ = extraout_XMM0_Db_02 + 0x40 >> 7;
        auVar55._8_4_ = extraout_XMM0_Dc_02 + 0x40 >> 7;
        auVar55._12_4_ = extraout_XMM0_Dd_02 + 0x40 >> 7;
        auVar108 = packssdw(auVar134,auVar55);
        sVar11 = auVar108._0_2_;
        sVar12 = auVar108._2_2_;
        sVar13 = auVar108._4_2_;
        sVar14 = auVar108._6_2_;
        sVar15 = auVar108._8_2_;
        sVar16 = auVar108._10_2_;
        sVar17 = auVar108._12_2_;
        sVar18 = auVar108._14_2_;
        *(ulong *)(puVar33 + dst_stride) =
             CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar108[0xe] - (0xff < sVar18),
                      CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar108[0xc] - (0xff < sVar17),
                               CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar108[10] -
                                        (0xff < sVar16),
                                        CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar108[8] -
                                                 (0xff < sVar15),
                                                 CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                          auVar108[6] - (0xff < sVar14),
                                                          CONCAT12((0 < sVar13) * (sVar13 < 0x100) *
                                                                   auVar108[4] - (0xff < sVar13),
                                                                   CONCAT11((0 < sVar12) *
                                                                            (sVar12 < 0x100) *
                                                                            auVar108[2] -
                                                                            (0xff < sVar12),
                                                                            (0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar108[0] -
                                                                            (0xff < sVar11))))))));
        lVar35 = lVar35 + 2;
        _local_168 = local_e8[0];
        _uStack_160 = local_e8[1];
        local_158[0] = local_f8[0];
        local_158[1] = local_f8[1];
        local_148[0] = _local_228;
        local_148[1] = _uStack_220;
        local_138[0] = local_108[0];
        local_138[1] = local_108[1];
        puVar33 = puVar33 + (long)dst_stride * 2;
        puVar29 = puVar29 + lVar27 * 2;
        local_128 = (uint8_t)uVar2;
        uStack_126 = uVar36;
        uStack_124 = uVar72;
        uStack_122 = uVar74;
        uStack_120 = uVar76;
        uStack_11e = uVar78;
        uStack_11c = uVar80;
        uStack_11a = uVar82;
        local_1c8 = alVar20;
        local_1b8 = alVar22;
        local_1a8 = alVar23;
        local_198 = alVar25;
        local_188 = alVar123;
        local_178 = alVar26;
      } while (lVar35 < h);
      uVar30 = uVar30 + 8;
      dst = dst + 8;
      lVar34 = lVar34 + 8;
      lVar32 = lVar32 + 8;
    } while (uVar30 < local_d0);
  }
  return;
}

Assistant:

void av1_convolve_y_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_y,
                            const int subpel_y_qn) {
  if (filter_params_y->taps > 8) {
    if (w < 8) {
      av1_convolve_y_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_y, subpel_y_qn);
    } else {
      convolve_y_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_y, subpel_y_qn);
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_vert * src_stride;
    const __m128i round_const = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
    const __m128i round_shift = _mm_cvtsi32_si128(FILTER_BITS);
    __m128i coeffs[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

    if (w <= 4) {
      __m128i s[8], src6, res, res_round, res16;
      int res_int;
      s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                               xx_loadl_32(src_ptr + 1 * src_stride));
      s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                               xx_loadl_32(src_ptr + 2 * src_stride));
      s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                               xx_loadl_32(src_ptr + 3 * src_stride));
      s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                               xx_loadl_32(src_ptr + 4 * src_stride));
      s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                               xx_loadl_32(src_ptr + 5 * src_stride));
      src6 = xx_loadl_32(src_ptr + 6 * src_stride);
      s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

      do {
        s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
        src6 = xx_loadl_32(src_ptr + 8 * src_stride);
        s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

        res = convolve_lo_y(s + 0, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        res = convolve_lo_y(s + 1, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
        h -= 2;
      } while (h);
    } else {
      assert(!(w % 8));
      int j = 0;
      do {
        __m128i s[8], src6, res_lo, res_hi;
        __m128i res_lo_round, res_hi_round, res16, res;
        const uint8_t *data = &src_ptr[j];

        src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
        s[0] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
        s[1] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
        s[2] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
        s[3] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
        s[4] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
        s[5] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

        int i = 0;
        do {
          data = &src_ptr[i * src_stride + j];
          s[6] = _mm_unpacklo_epi8(
              src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
          src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
          s[7] = _mm_unpacklo_epi8(
              _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

          res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          s[0] = s[2];
          s[1] = s[3];
          s[2] = s[4];
          s[3] = s[5];
          s[4] = s[6];
          s[5] = s[7];
        } while (i < h);
        j += 8;
      } while (j < w);
    }
  }
}